

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O3

cbtDbvtNode * removeleaf(cbtDbvt *pdbvt,cbtDbvtNode *leaf)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  cbtDbvtNode *pcVar8;
  undefined1 auVar9 [16];
  long lVar10;
  cbtDbvtNode *pcVar11;
  cbtDbvtNode *pcVar12;
  
  if (pdbvt->m_root == leaf) {
    pdbvt->m_root = (cbtDbvtNode *)0x0;
    pcVar12 = (cbtDbvtNode *)0x0;
  }
  else {
    pcVar12 = leaf->parent;
    pcVar11 = pcVar12->parent;
    pcVar8 = *(cbtDbvtNode **)
              ((long)(&pcVar12->volume + 1) +
              ((ulong)((pcVar12->field_2).childs[1] != leaf) + 1) * 8);
    if (pcVar11 == (cbtDbvtNode *)0x0) {
      pdbvt->m_root = pcVar8;
      pcVar8->parent = (cbtDbvtNode *)0x0;
      cbtAlignedFreeInternal(pdbvt->m_free);
      pdbvt->m_free = pcVar12;
    }
    else {
      *(cbtDbvtNode **)
       ((long)(&pcVar11->volume + 1) + ((ulong)((pcVar11->field_2).childs[1] == pcVar12) + 1) * 8) =
           pcVar8;
      pcVar8->parent = pcVar11;
      cbtAlignedFreeInternal(pdbvt->m_free);
      pdbvt->m_free = pcVar12;
      do {
        fVar1 = (pcVar11->volume).mi.m_floats[0];
        fVar2 = (pcVar11->volume).mi.m_floats[1];
        fVar3 = (pcVar11->volume).mi.m_floats[2];
        fVar4 = (pcVar11->volume).mx.m_floats[0];
        fVar5 = (pcVar11->volume).mx.m_floats[1];
        fVar6 = (pcVar11->volume).mx.m_floats[2];
        pcVar12 = (pcVar11->field_2).childs[0];
        pcVar8 = (pcVar11->field_2).childs[1];
        lVar10 = 4;
        do {
          auVar9 = vminss_avx(ZEXT416(*(uint *)((long)(&(pcVar12->volume).mi + -1) + lVar10 * 4)),
                              ZEXT416(*(uint *)((long)(&(pcVar8->volume).mi + -1) + lVar10 * 4)));
          *(int *)((long)(&(pcVar11->volume).mi + -1) + lVar10 * 4) = auVar9._0_4_;
          auVar9 = vmaxss_avx(ZEXT416((uint)(pcVar12->volume).mi.m_floats[lVar10]),
                              ZEXT416((uint)(pcVar8->volume).mi.m_floats[lVar10]));
          (pcVar11->volume).mi.m_floats[lVar10] = auVar9._0_4_;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 7);
        fVar7 = (pcVar11->volume).mi.m_floats[0];
        if ((fVar1 == fVar7) && (!NAN(fVar1) && !NAN(fVar7))) {
          fVar1 = (pcVar11->volume).mi.m_floats[1];
          if ((fVar2 == fVar1) && (!NAN(fVar2) && !NAN(fVar1))) {
            fVar1 = (pcVar11->volume).mi.m_floats[2];
            if ((fVar3 == fVar1) && (!NAN(fVar3) && !NAN(fVar1))) {
              fVar1 = (pcVar11->volume).mx.m_floats[0];
              if ((fVar4 == fVar1) && (!NAN(fVar4) && !NAN(fVar1))) {
                fVar1 = (pcVar11->volume).mx.m_floats[1];
                if ((fVar5 == fVar1) && (!NAN(fVar5) && !NAN(fVar1))) {
                  fVar1 = (pcVar11->volume).mx.m_floats[2];
                  if ((fVar6 == fVar1) && (!NAN(fVar6) && !NAN(fVar1))) {
                    return pcVar11;
                  }
                }
              }
            }
          }
        }
        pcVar11 = pcVar11->parent;
      } while (pcVar11 != (cbtDbvtNode *)0x0);
    }
    pcVar12 = pdbvt->m_root;
  }
  return pcVar12;
}

Assistant:

static cbtDbvtNode* removeleaf(cbtDbvt* pdbvt,
							  cbtDbvtNode* leaf)
{
	if (leaf == pdbvt->m_root)
	{
		pdbvt->m_root = 0;
		return (0);
	}
	else
	{
		cbtDbvtNode* parent = leaf->parent;
		cbtDbvtNode* prev = parent->parent;
		cbtDbvtNode* sibling = parent->childs[1 - indexof(leaf)];
		if (prev)
		{
			prev->childs[indexof(parent)] = sibling;
			sibling->parent = prev;
			deletenode(pdbvt, parent);
			while (prev)
			{
				const cbtDbvtVolume pb = prev->volume;
				Merge(prev->childs[0]->volume, prev->childs[1]->volume, prev->volume);
				if (NotEqual(pb, prev->volume))
				{
					prev = prev->parent;
				}
				else
					break;
			}
			return (prev ? prev : pdbvt->m_root);
		}
		else
		{
			pdbvt->m_root = sibling;
			sibling->parent = 0;
			deletenode(pdbvt, parent);
			return (pdbvt->m_root);
		}
	}
}